

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

Publication * __thiscall
helics::ValueFederate::getPublication(ValueFederate *this,string_view name,int index1,int index2)

{
  pointer __lhs;
  Publication *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  allocator<char> local_d1 [25];
  ValueFederateManager *in_stack_ffffffffffffff48;
  string_view in_stack_ffffffffffffff50;
  
  __lhs = std::
          unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
          ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                        *)0x2935bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff00,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef8,
             (allocator<char> *)in_stack_fffffffffffffef0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char)((ulong)in_stack_fffffffffffffec0 >> 0x38));
  CLI::std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char)((ulong)in_stack_fffffffffffffec0 >> 0x38));
  CLI::std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffec0);
  this_00 = ValueFederateManager::getPublication
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_d1);
  return this_00;
}

Assistant:

const Publication&
    ValueFederate::getPublication(std::string_view name, int index1, int index2) const
{
    return vfManager->getPublication(std::string(name) + '_' + std::to_string(index1) + '_' +
                                     std::to_string(index2));
}